

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O3

void PatchHandleArchipelago::add_proc_init_archipelago_ground_items(ROM *rom)

{
  _func_int **pp_Var1;
  uint32_t uVar2;
  Code *code;
  Code func;
  Param local_138;
  undefined8 local_130;
  undefined1 local_128 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_e0;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0xc0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpi(&local_a8,(ImmediateValue *)local_128,&local_138,BYTE);
  pp_Var1 = (_func_int **)(local_128 + 0x10);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"regular_item_entity","");
  md::Code::bcc(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0x58;
  md::Code::cmpi(&local_a8,(ImmediateValue *)local_128,&local_138,BYTE);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"not_an_item","");
  md::Code::bne(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x2000b;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262c98;
  local_130 = 0x23;
  md::Code::move(&local_a8,&local_138,(Param *)local_128,BYTE);
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20036;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262c98;
  local_130 = 0x7f;
  md::Code::move(&local_a8,&local_138,(Param *)local_128,BYTE);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00262be0;
  md::Code::clr(&local_a8,(Param *)local_128,WORD);
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = '\x02';
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x2fffe;
  local_130._0_1_ = 2;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,BYTE);
  local_130._0_1_ = 2;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0x3;
  md::Code::andi(&local_a8,(ImmediateValue *)local_128,&local_138,BYTE);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00262be0;
  md::Code::lsx(&local_a8,'\b',(DataRegister *)local_128,true,WORD);
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = 2;
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20001;
  local_130 = CONCAT71(local_130._1_7_,2);
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,BYTE);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"not_zero","");
  md::Code::bne(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = CONCAT71(local_130._1_7_,2);
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = &PTR_getXn_00262c98;
  local_128._8_8_ = (pointer)0x100000002;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,WORD);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"not_zero","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = CONCAT71(local_130._1_7_,2);
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20034;
  md::Code::move(&local_a8,&local_138,(Param *)local_128,WORD);
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20025;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262c98;
  local_130 = 0x1c;
  md::Code::move(&local_a8,&local_138,(Param *)local_128,BYTE);
  local_128._0_8_ = &PTR_getXn_00262d18;
  local_128[0x10] = 1;
  local_128._8_8_ = &PTR_getXn_00262c50;
  _Stack_110._M_impl._0_3_ = 0x20027;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262c98;
  local_130 = 0x1c;
  md::Code::move(&local_a8,&local_138,(Param *)local_128,BYTE);
  local_128._0_8_ = &PTR_getXn_00262cd8;
  local_128._8_8_ = (pointer)0x2000196fa;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"not_an_item","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00262cd8;
  local_128._8_8_ = (pointer)0x20001972a;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"regular_item_entity","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00262cd8;
  local_128._8_8_ = (pointer)0x200019638;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  uVar2 = md::ROM::inject_code(rom,&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_110._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl._0_8_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _Stack_110._M_impl._0_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_e0._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_130 = CONCAT44(2,uVar2);
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_128,&local_138);
  md::ROM::set_code(rom,0x19630,code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_e0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_110);
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void add_proc_init_archipelago_ground_items(md::ROM& rom)
    {
        md::Code func;
        {
            func.cmpib(0xC0, reg_D0);
            func.bcc("regular_item_entity");
            {
                func.cmpib(ENTITY_ARCHIPELAGO_ITEM, reg_D0);
                func.bne("not_an_item");
                {
                    func.moveb(0x23, addr_(reg_A1, 0x0B));
                    func.moveb(ITEM_ARCHIPELAGO, addr_(reg_A1, 0x36));  // Contents value

                    // Apply custom behavior, or 0x0002 if none was specified
                    func.clrw(reg_D2);
                    func.moveb(addr_(reg_A2, 0xFFFE), reg_D2);
                    func.andib(0x03, reg_D2);
                    func.lslw(0x08, reg_D2);
                    func.moveb(addr_(reg_A2, 0x01), reg_D2);
                    func.bne("not_zero");
                    {
                        func.movew(0x0002, reg_D2);
                    }
                    func.label("not_zero");
                    func.movew(reg_D2, addr_(reg_A1, 0x34));

                    func.moveb(0x1C, addr_(reg_A1, 0x25));              // Sprite (animation)
                    func.moveb(0x1C, addr_(reg_A1, 0x27));              // Sprite (frame)
                    func.jmp(0x196FA);
                }
                func.label("not_an_item");
                func.jmp(0x1972A);
            }
            func.label("regular_item_entity");
            func.jmp(0x19638);
        }

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x19630, md::Code().jmp(func_addr));
    }